

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::setupGlobals(TranslateToFuzzReader *this)

{
  uint uVar1;
  pointer puVar2;
  _Head_base<0UL,_wasm::Global_*,_false> _Var3;
  Module *module;
  _Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_> _Var4;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  BasicType BVar8;
  Expression *pEVar9;
  Type type;
  Global *global_00;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar10;
  ulong uVar11;
  bool bVar12;
  Name root;
  string_view sVar13;
  FindAll<wasm::GlobalGet> local_80;
  _Head_base<0UL,_wasm::Global_*,_false> local_68;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> global_2;
  pointer local_58;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c useGlobalLater;
  
  puVar10 = (this->wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar2) {
    do {
      _Var3._M_head_impl =
           (puVar10->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
        uVar1 = (this->wasm->features).features;
        if ((uVar1 >> 10 & 1) == 0) {
          FindAll<wasm::GlobalGet>::FindAll
                    (&local_80,
                     ((puVar10->_M_t).
                      super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init);
          bVar12 = local_80.list.
                   super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl
                   .super__Vector_impl_data._M_start !=
                   local_80.list.
                   super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        else {
          bVar12 = false;
        }
        if (((uVar1 >> 10 & 1) == 0) &&
           (local_80.list.super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_80.list.
                          super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.list.
                                super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.list.
                                super__Vector_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar12) goto LAB_0013e436;
      }
      else if (this->preserveImportsAndExports == false) {
        *(undefined8 *)
         &((Name *)((long)&(_Var3._M_head_impl)->super_Importable + 0x28))->super_IString = 0;
        *(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x30) = (char *)0x0;
        _Var3._M_head_impl =
             (puVar10->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        *(undefined8 *)
         &((Name *)((long)&(_Var3._M_head_impl)->super_Importable + 0x18))->super_IString = 0;
        *(char **)((long)&(_Var3._M_head_impl)->super_Importable + 0x20) = (char *)0x0;
LAB_0013e436:
        pEVar9 = makeConst(this,(Type)(((puVar10->_M_t).
                                        super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                        .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)
                                      ->type).id);
        ((puVar10->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init = pEVar9;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar2);
  }
  local_50.this = this;
  if ((this->wasm->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->wasm->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = Random::upTo(&this->random,100);
    puVar10 = (this->wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar10 != puVar2) {
      do {
        uVar7 = Random::upTo(&this->random,100);
        if (uVar7 < uVar6) {
          setupGlobals::anon_class_8_1_8991fb9c::operator()
                    (&local_50,
                     (puVar10->_M_t).
                     super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
    }
  }
  useGlobalLater.this = (TranslateToFuzzReader *)&this->random;
  uVar6 = Random::upTo((Random *)useGlobalLater.this,
                       (this->fuzzParams->super_FuzzParams).MAX_GLOBALS);
  if (uVar6 != 0) {
    uVar11 = (ulong)uVar6;
    do {
      type = getConcreteType(this);
      uVar6 = Random::upTo((Random *)useGlobalLater.this,3);
      pEVar9 = makeTrivial(this,type);
      FindAll<wasm::RefAs>::FindAll((FindAll<wasm::RefAs> *)&stack0xffffffffffffff98,pEVar9);
      uVar5 = global_2;
      _Var4.super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
           (_Head_base<0UL,_wasm::Global_*,_false>)
           (_Head_base<0UL,_wasm::Global_*,_false>)local_68._M_head_impl;
      if (local_68._M_head_impl != (Global *)0x0) {
        operator_delete(local_68._M_head_impl,(long)local_58 - (long)local_68._M_head_impl);
      }
      if (_Var4.super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl ==
          (_Head_base<0UL,_wasm::Global_*,_false>)
          uVar5._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl) {
        if (((type.id & 1) != 0 && 6 < type.id) && (pEVar9->_id != TupleMakeId)) {
          pEVar9 = makeConst(this,type);
          if (pEVar9->_id != TupleMakeId) {
            __assert_fail("init->is<TupleMake>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                          ,0x2b7,"void wasm::TranslateToFuzzReader::setupGlobals()");
          }
        }
      }
      else {
        BVar8 = Random::
                pick<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                          ((Random *)useGlobalLater.this,i32,i64,f32,f64);
        type.id._4_4_ = 0;
        type.id._0_4_ = BVar8;
        pEVar9 = makeConst(this,type);
      }
      module = this->wasm;
      root.super_IString.str = (IString)::wasm::IString::interned(7,"global$",0);
      sVar13 = (string_view)Names::getValidGlobalName(module,root);
      local_68._M_head_impl = (Global *)operator_new(0x50);
      ((local_68._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
      ((local_68._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
           (char *)0x0;
      *(undefined8 *)&((local_68._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_68._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_68._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_68._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      ((local_68._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_68._M_head_impl)->type).id = 0;
      (local_68._M_head_impl)->init = (Expression *)0x0;
      *(undefined8 *)&(local_68._M_head_impl)->mutable_ = 0;
      ((local_68._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar13;
      ((local_68._M_head_impl)->type).id = type.id;
      (local_68._M_head_impl)->init = pEVar9;
      (local_68._M_head_impl)->mutable_ = uVar6 == 0;
      global_00 = (Global *)::wasm::Module::addGlobal((unique_ptr *)this->wasm);
      setupGlobals::anon_class_8_1_8991fb9c::operator()(&local_50,global_00);
      if (local_68._M_head_impl != (Global *)0x0) {
        operator_delete(local_68._M_head_impl,0x50);
      }
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupGlobals() {
  // If there were initial wasm contents, there may be imported globals. That
  // would be a problem in the fuzzer harness as we'd error if we do not
  // provide them (and provide the proper type, etc.).
  // Avoid that, so that all the standard fuzzing infrastructure can always
  // run the wasm.
  for (auto& global : wasm.globals) {
    if (global->imported()) {
      if (!preserveImportsAndExports) {
        // Remove import info from imported globals, and give them a simple
        // initializer.
        global->module = global->base = Name();
        global->init = makeConst(global->type);
      }
    } else {
      // If the initialization referred to an imported global, it no longer can
      // point to the same global after we make it a non-imported global unless
      // GC is enabled, since before GC, Wasm only made imported globals
      // available in constant expressions.
      if (!wasm.features.hasGC() &&
          !FindAll<GlobalGet>(global->init).list.empty()) {
        global->init = makeConst(global->type);
      }
    }
  }

  auto useGlobalLater = [&](Global* global) {
    auto type = global->type;
    auto name = global->name;
    globalsByType[type].push_back(name);
    if (global->mutable_) {
      mutableGlobalsByType[type].push_back(name);
    } else {
      immutableGlobalsByType[type].push_back(name);
      if (global->imported()) {
        importedImmutableGlobalsByType[type].push_back(name);
      }
    }
  };

  // Randomly assign some globals from initial content to be ignored for the
  // fuzzer to use. Such globals will only be used from initial content. This is
  // important to preserve some real-world patterns, like the "once" pattern in
  // which a global is used in one function only. (If we randomly emitted gets
  // and sets of such globals, we'd with very high probability end up breaking
  // that pattern, and not fuzzing it at all.)
  if (!wasm.globals.empty()) {
    unsigned percentUsedInitialGlobals = upTo(100);
    for (auto& global : wasm.globals) {
      if (upTo(100) < percentUsedInitialGlobals) {
        useGlobalLater(global.get());
      }
    }
  }

  // Create new random globals.
  for (size_t index = upTo(fuzzParams->MAX_GLOBALS); index > 0; --index) {
    auto type = getConcreteType();
    // Prefer immutable ones as they can be used in global.gets in other
    // globals, for more interesting patterns.
    auto mutability = oneIn(3) ? Builder::Mutable : Builder::Immutable;

    // We can only make something trivial (like a constant) in a global
    // initializer.
    auto* init = makeTrivial(type);

    if (!FindAll<RefAs>(init).list.empty()) {
      // When creating this initial value we ended up emitting a RefAs, which
      // means we had to stop in the middle of an overly-nested struct or array,
      // which we can break out of using ref.as_non_null of a nullable ref. That
      // traps in normal code, which is bad enough, but it does not even
      // validate in a global. Switch to something safe instead.
      type = getMVPType();
      init = makeConst(type);
    } else if (type.isTuple() && !init->is<TupleMake>()) {
      // For now we disallow anything but tuple.make at the top level of tuple
      // globals (see details in wasm-binary.cpp). In the future we may allow
      // global.get or other things here.
      init = makeConst(type);
      assert(init->is<TupleMake>());
    }
    auto global = builder.makeGlobal(
      Names::getValidGlobalName(wasm, "global$"), type, init, mutability);
    useGlobalLater(wasm.addGlobal(std::move(global)));
  }
}